

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_con___char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>>
          (StringTree *this,long pos,size_t branchIndex,StringTree *first,
          NoInfer<kj::StringTree> *rest,NoInfer<kj::ArrayPtr<const_char>_> *rest_1,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_2,NoInfer<kj::ArrayPtr<const_char>_> *rest_3,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_4,NoInfer<kj::ArrayPtr<const_char>_> *rest_5,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_6,NoInfer<kj::ArrayPtr<const_char>_> *rest_7,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_8,NoInfer<kj::ArrayPtr<const_char>_> *rest_9,
          NoInfer<kj::StringTree> *rest_10,NoInfer<kj::ArrayPtr<const_char>_> *rest_11,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_12,NoInfer<kj::ArrayPtr<const_char>_> *rest_13,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_14,NoInfer<kj::ArrayPtr<const_char>_> *rest_15,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_16,NoInfer<kj::ArrayPtr<const_char>_> *rest_17,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_18,NoInfer<kj::ArrayPtr<const_char>_> *rest_19
          ,NoInfer<kj::StringTree> *rest_20,NoInfer<kj::ArrayPtr<const_char>_> *rest_21,
          NoInfer<kj::String> *rest_22,NoInfer<kj::ArrayPtr<const_char>_> *rest_23,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_24,NoInfer<kj::ArrayPtr<const_char>_> *rest_25,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_26,NoInfer<kj::ArrayPtr<const_char>_> *rest_27,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_28,NoInfer<kj::ArrayPtr<const_char>_> *rest_29,
          NoInfer<kj::String> *rest_30,NoInfer<kj::ArrayPtr<const_char>_> *rest_31,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_32,NoInfer<kj::ArrayPtr<const_char>_> *rest_33
          ,NoInfer<kj::StringTree> *rest_34,NoInfer<kj::ArrayPtr<const_char>_> *rest_35,
          NoInfer<kj::String> *rest_36,NoInfer<kj::ArrayPtr<const_char>_> *rest_37,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_38,NoInfer<kj::ArrayPtr<const_char>_> *rest_39,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_40,NoInfer<kj::ArrayPtr<const_char>_> *rest_41,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_42,NoInfer<kj::ArrayPtr<const_char>_> *rest_43,
          NoInfer<kj::String> *rest_44,NoInfer<kj::ArrayPtr<const_char>_> *rest_45,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_46,NoInfer<kj::ArrayPtr<const_char>_> *rest_47
          ,NoInfer<kj::StringTree> *rest_48,NoInfer<kj::StringTree> *rest_49,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_50,NoInfer<kj::ArrayPtr<const_char>_> *rest_51,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_52,NoInfer<kj::ArrayPtr<const_char>_> *rest_53,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_54,NoInfer<kj::String> *rest_55,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_56,NoInfer<kj::ArrayPtr<const_char>_> *rest_57,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_58,NoInfer<kj::String> *rest_59,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_60,NoInfer<kj::CappedArray<char,_14UL>_> *rest_61
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,NoInfer<kj::StringTree> *rest_63)

{
  char *pcVar1;
  Branch *pBVar2;
  StringTree *pSVar3;
  ArrayPtr<const_char> *pAVar4;
  ArrayPtr<const_char> *pAVar5;
  ArrayPtr<const_char> *pAVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  ArrayPtr<const_char> *pAVar10;
  CappedArray<char,_14UL> *pCVar11;
  ArrayPtr<const_char> *pAVar12;
  StringTree *pSVar13;
  ArrayPtr<const_char> *pAVar14;
  ArrayPtr<const_char> *pAVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  ArrayPtr<const_char> *pAVar20;
  CappedArray<char,_14UL> *pCVar21;
  ArrayPtr<const_char> *pAVar22;
  StringTree *pSVar23;
  ArrayPtr<const_char> *pAVar24;
  String *pSVar25;
  ArrayPtr<const_char> *pAVar26;
  ArrayPtr<const_char> *pAVar27;
  ArrayPtr<const_char> *pAVar28;
  ArrayPtr<const_char> *pAVar29;
  ArrayPtr<const_char> *pAVar30;
  ArrayPtr<const_char> *pAVar31;
  ArrayPtr<const_char> *pAVar32;
  String *pSVar33;
  ArrayPtr<const_char> *pAVar34;
  CappedArray<char,_14UL> *pCVar35;
  ArrayPtr<const_char> *pAVar36;
  StringTree *pSVar37;
  ArrayPtr<const_char> *pAVar38;
  String *pSVar39;
  ArrayPtr<const_char> *pAVar40;
  ArrayPtr<const_char> *pAVar41;
  ArrayPtr<const_char> *pAVar42;
  ArrayPtr<const_char> *pAVar43;
  ArrayPtr<const_char> *pAVar44;
  ArrayPtr<const_char> *pAVar45;
  ArrayPtr<const_char> *pAVar46;
  String *pSVar47;
  ArrayPtr<const_char> *pAVar48;
  CappedArray<char,_14UL> *pCVar49;
  ArrayPtr<const_char> *pAVar50;
  StringTree *pSVar51;
  StringTree *pSVar52;
  ArrayPtr<const_char> *pAVar53;
  ArrayPtr<const_char> *pAVar54;
  ArrayPtr<const_char> *pAVar55;
  ArrayPtr<const_char> *pAVar56;
  ArrayPtr<const_char> *pAVar57;
  String *pSVar58;
  ArrayPtr<const_char> *pAVar59;
  ArrayPtr<const_char> *pAVar60;
  ArrayPtr<const_char> *pAVar61;
  String *pSVar62;
  ArrayPtr<const_char> *pAVar63;
  CappedArray<char,_14UL> *pCVar64;
  ArrayPtr<const_char> *pAVar65;
  StringTree *pSVar66;
  ArrayPtr<const_char> *pAVar67;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::String> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000230;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000238;
  NoInfer<kj::String> *in_stack_00000240;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000248;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000250;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000258;
  NoInfer<kj::StringTree> *in_stack_00000260;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000268;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000270;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000278;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000280;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000288;
  NoInfer<kj::String> *in_stack_00000290;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000298;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002a8;
  NoInfer<kj::String> *in_stack_000002b0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002b8;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_000002c0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002c8;
  NoInfer<kj::StringTree> *in_stack_000002d0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002d8;
  NoInfer<kj::String> *in_stack_000002e0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002e8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f0;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000002f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000300;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000308;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000310;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000318;
  NoInfer<kj::String> *in_stack_00000320;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000328;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000330;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000338;
  ArrayPtr<const_char> *rest_local_1;
  StringTree *rest_local;
  StringTree *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pcVar1 = String::begin(&this->text);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  pBVar2->index = pos - (long)pcVar1;
  pSVar3 = mv<kj::StringTree>(first);
  pBVar2 = Array<kj::StringTree::Branch>::operator[](&this->branches,branchIndex);
  operator=(&pBVar2->content,pSVar3);
  pSVar3 = fwd<kj::StringTree>(rest);
  pAVar4 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_2);
  pAVar6 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_4);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar10 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pCVar11 = fwd<kj::CappedArray<char,14ul>>(rest_8);
  pAVar12 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pSVar13 = fwd<kj::StringTree>(rest_10);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pAVar20 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pCVar21 = fwd<kj::CappedArray<char,14ul>>(rest_18);
  pAVar22 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pSVar23 = fwd<kj::StringTree>(rest_20);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pSVar25 = fwd<kj::String>(rest_22);
  pAVar26 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pAVar27 = fwd<kj::ArrayPtr<char_const>>(rest_24);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_25);
  pAVar29 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pSVar33 = fwd<kj::String>(rest_30);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_31);
  pCVar35 = fwd<kj::CappedArray<char,14ul>>(rest_32);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pSVar37 = fwd<kj::StringTree>(rest_34);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_35);
  pSVar39 = fwd<kj::String>(rest_36);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_37);
  pAVar41 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pAVar42 = fwd<kj::ArrayPtr<char_const>>(rest_39);
  pAVar43 = fwd<kj::ArrayPtr<char_const>>(rest_40);
  pAVar44 = fwd<kj::ArrayPtr<char_const>>(rest_41);
  pAVar45 = fwd<kj::ArrayPtr<char_const>>(rest_42);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pSVar47 = fwd<kj::String>(rest_44);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pCVar49 = fwd<kj::CappedArray<char,14ul>>(rest_46);
  pAVar50 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pSVar51 = fwd<kj::StringTree>(rest_48);
  pSVar52 = fwd<kj::StringTree>(rest_49);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pAVar54 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_52);
  pAVar56 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pAVar57 = fwd<kj::ArrayPtr<char_const>>(rest_54);
  pSVar58 = fwd<kj::String>(rest_55);
  pAVar59 = fwd<kj::ArrayPtr<char_const>>(rest_56);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_57);
  pAVar61 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pSVar62 = fwd<kj::String>(rest_59);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pCVar64 = fwd<kj::CappedArray<char,14ul>>(rest_61);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pSVar66 = fwd<kj::StringTree>(rest_63);
  pAVar67 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::String>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000230);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000238);
  fwd<kj::String>(in_stack_00000240);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000248);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000250);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000258);
  fwd<kj::StringTree>(in_stack_00000260);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000268);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000270);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000278);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000280);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000288);
  fwd<kj::String>(in_stack_00000290);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000298);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002a8);
  fwd<kj::String>(in_stack_000002b0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002b8);
  fwd<kj::CappedArray<char,14ul>>(in_stack_000002c0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002c8);
  fwd<kj::StringTree>(in_stack_000002d0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002d8);
  fwd<kj::String>(in_stack_000002e0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002e8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f0);
  fwd<kj::ArrayPtr<char_const>>(in_stack_000002f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000300);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000308);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000310);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000318);
  fwd<kj::String>(in_stack_00000320);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000328);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000330);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000338);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPt___char_const>_kj__String_kj__ArrayPtr<char_const>_kj__CappedArray<char,14ul>_kj__ArrayPtr<char_const>>
            (this,pos,branchIndex + 1,pSVar3,pAVar4,pAVar5,pAVar6,pAVar7,pAVar8,pAVar9,pAVar10,
             pCVar11,pAVar12,pSVar13,pAVar14,pAVar15,pAVar16,pAVar17,pAVar18,pAVar19,pAVar20,pCVar21
             ,pAVar22,pSVar23,pAVar24,pSVar25,pAVar26,pAVar27,pAVar28,pAVar29,pAVar30,pAVar31,
             pAVar32,pSVar33,pAVar34,pCVar35,pAVar36,pSVar37,pAVar38,pSVar39,pAVar40,pAVar41,pAVar42
             ,pAVar43,pAVar44,pAVar45,pAVar46,pSVar47,pAVar48,pCVar49,pAVar50,pSVar51,pSVar52,
             pAVar53,pAVar54,pAVar55,pAVar56,pAVar57,pSVar58,pAVar59,pAVar60,pAVar61,pSVar62,pAVar63
             ,pCVar64,pAVar65,pSVar66,pAVar67);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, StringTree&& first, Rest&&... rest) {
  branches[branchIndex].index = pos - text.begin();
  branches[branchIndex].content = kj::mv(first);
  fill(pos, branchIndex + 1, kj::fwd<Rest>(rest)...);
}